

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuaranteedThroughputProbabilisticSampler.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update
          (GuaranteedThroughputProbabilisticSampler *this,double lowerBound,double samplingRate)

{
  initializer_list<jaegertracing::Tag> __l;
  RateLimitingSampler *this_00;
  double dVar1;
  Tag *local_190;
  allocator local_151;
  string local_150;
  allocator local_119;
  string local_118;
  Tag *local_f8;
  Tag local_f0;
  Tag local_a8;
  iterator local_60;
  size_type local_58;
  ProbabilisticSampler local_50;
  undefined8 local_20;
  double samplingRate_local;
  double lowerBound_local;
  GuaranteedThroughputProbabilisticSampler *this_local;
  
  local_20 = samplingRate;
  samplingRate_local = lowerBound;
  lowerBound_local = (double)this;
  if ((this->_samplingRate != samplingRate) || (NAN(this->_samplingRate) || NAN(samplingRate))) {
    ProbabilisticSampler::ProbabilisticSampler(&local_50,samplingRate);
    ProbabilisticSampler::operator=(&this->_probabilisticSampler,&local_50);
    ProbabilisticSampler::~ProbabilisticSampler(&local_50);
    dVar1 = ProbabilisticSampler::samplingRate(&this->_probabilisticSampler);
    this->_samplingRate = dVar1;
    local_f8 = &local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"sampler.type",&local_119);
    Tag::Tag<char_const*const&>(&local_f0,&local_118,&kSamplerTypeLowerBound);
    local_f8 = &local_a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"sampler.param",&local_151);
    Tag::Tag<double&>(&local_a8,&local_150,&this->_samplingRate);
    local_60 = &local_f0;
    local_58 = 2;
    __l._M_len = 2;
    __l._M_array = local_60;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
              (&this->_tags,__l);
    local_190 = (Tag *)&local_60;
    do {
      local_190 = local_190 + -1;
      Tag::~Tag(local_190);
    } while (local_190 != &local_f0);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  if ((this->_lowerBound != samplingRate_local) ||
     (NAN(this->_lowerBound) || NAN(samplingRate_local))) {
    this_00 = (RateLimitingSampler *)operator_new(0x70);
    RateLimitingSampler::RateLimitingSampler(this_00,samplingRate_local);
    std::
    unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
    ::reset(&this->_lowerBoundSampler,this_00);
    this->_lowerBound = samplingRate_local;
  }
  return;
}

Assistant:

void GuaranteedThroughputProbabilisticSampler::update(double lowerBound,
                                                      double samplingRate)
{
    if (_samplingRate != samplingRate) {
        _probabilisticSampler = ProbabilisticSampler(samplingRate);
        _samplingRate = _probabilisticSampler.samplingRate();
        _tags = { { kSamplerTypeTagKey, kSamplerTypeLowerBound },
                  { kSamplerParamTagKey, _samplingRate } };
    }

    if (_lowerBound != lowerBound) {
        _lowerBoundSampler.reset(new RateLimitingSampler(lowerBound));
        _lowerBound = lowerBound;
    }
}